

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

DPIImportSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DPIImportSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::syntax::FunctionPrototypeSyntax&,slang::parsing::Token>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,Token *args_3,Token *args_4,Token *args_5,
          FunctionPrototypeSyntax *args_6,Token *args_7)

{
  Token specString;
  Token property;
  Token c_identifier;
  Token equals;
  DPIImportSyntax *pDVar1;
  undefined8 *in_RCX;
  Token *in_RDX;
  undefined8 *in_R8;
  undefined8 *in_R9;
  long in_stack_00000008;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000010;
  Token *in_stack_00000018;
  size_t in_stack_ffffffffffffff18;
  size_t in_stack_ffffffffffffff20;
  BumpAllocator *in_stack_ffffffffffffff28;
  
  pDVar1 = (DPIImportSyntax *)
           allocate(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  specString.info = (Info *)pDVar1;
  specString._0_8_ = in_stack_00000018->info;
  property.info = (Info *)*in_R9;
  property._0_8_ = *(undefined8 *)(in_stack_00000008 + 8);
  c_identifier.info = (Info *)*in_R8;
  c_identifier._0_8_ = in_R9[1];
  equals.info = (Info *)*in_RCX;
  equals._0_8_ = in_R8[1];
  slang::syntax::DPIImportSyntax::DPIImportSyntax
            (*(DPIImportSyntax **)in_stack_00000018,in_stack_00000010,*in_stack_00000018,specString,
             property,c_identifier,equals,(FunctionPrototypeSyntax *)in_RCX[1],*in_RDX);
  return pDVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }